

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O0

TGAColor __thiscall TRM::TGAImage::get(TGAImage *this,int x,int y)

{
  TGAColor TVar1;
  int y_local;
  int x_local;
  TGAImage *this_local;
  
  if ((((this->data == (uchar *)0x0) || (x < 0)) || (y < 0)) ||
     ((this->width <= x || (this->height <= y)))) {
    TGAColor::TGAColor((TGAColor *)((long)&this_local + 3));
  }
  else {
    TGAColor::TGAColor((TGAColor *)((long)&this_local + 3),
                       this->data + (x + y * this->width) * this->bytespp,(uchar)this->bytespp);
  }
  TVar1.bytespp = this_local._7_1_;
  TVar1.bgra[0] = this_local._3_1_;
  TVar1.bgra[1] = this_local._4_1_;
  TVar1.bgra[2] = this_local._5_1_;
  TVar1.bgra[3] = this_local._6_1_;
  return TVar1;
}

Assistant:

TGAColor TGAImage::get(int x, int y) {
  if (!data || x < 0 || y < 0 || x >= width || y >= height) {
    return TGAColor();
  }
  return TGAColor(data + (x + y * width) * bytespp, bytespp);
}